

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLVector3.cpp
# Opt level: O1

Vector3 * AML::cross(Vector3 *lhs,Vector3 *rhs)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  Vector3 *in_RDI;
  
  dVar1 = (lhs->field_0).data[0];
  dVar2 = (lhs->field_0).data[1];
  dVar3 = (rhs->field_0).data[2];
  dVar4 = (lhs->field_0).data[2];
  dVar5 = (rhs->field_0).data[0];
  dVar6 = (rhs->field_0).data[1];
  (in_RDI->field_0).data[0] = dVar2 * dVar3 - dVar6 * dVar4;
  (in_RDI->field_0).data[1] = dVar4 * dVar5 - dVar3 * dVar1;
  (in_RDI->field_0).data[2] = dVar1 * dVar6 - dVar5 * dVar2;
  return in_RDI;
}

Assistant:

Vector3 cross(const Vector3& lhs, const Vector3& rhs)
    {
        double x = (lhs.y * rhs.z) - (lhs.z * rhs.y);
        double y = (lhs.z * rhs.x) - (lhs.x * rhs.z);
        double z = (lhs.x * rhs.y) - (lhs.y * rhs.x);
        return Vector3(x, y, z);
    }